

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

void __thiscall
GlassMaterial::GlassMaterial
          (GlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color,
          float thickness)

{
  Texture *pTVar1;
  uchar *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  BRDFMaterial *this_00;
  float fVar7;
  Vector3f local_184;
  Vector3f local_178;
  Vector3f local_16c;
  Texture local_160;
  Texture local_f8;
  Texture local_90;
  
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_shade_001fa950;
  uVar4 = *(undefined4 *)&reflect_color->field_0x4;
  pTVar1 = reflect_color->source;
  (this->reflectColor).type = reflect_color->type;
  *(undefined4 *)&(this->reflectColor).field_0x4 = uVar4;
  (this->reflectColor).source = pTVar1;
  Vector3f::Vector3f(&(this->reflectColor).color,&reflect_color->color);
  std::function<Vector2f_(Vector2f)>::function(&(this->reflectColor).scale,&reflect_color->scale);
  (this->reflectColor).empty = reflect_color->empty;
  iVar5 = reflect_color->image_h;
  iVar6 = reflect_color->image_c;
  uVar4 = *(undefined4 *)&reflect_color->field_0x4c;
  puVar2 = reflect_color->image_buff_stbi;
  pfVar3 = reflect_color->hdr_buff;
  (this->reflectColor).image_w = reflect_color->image_w;
  (this->reflectColor).image_h = iVar5;
  (this->reflectColor).image_c = iVar6;
  *(undefined4 *)&(this->reflectColor).field_0x4c = uVar4;
  (this->reflectColor).image_buff_stbi = puVar2;
  (this->reflectColor).hdr_buff = pfVar3;
  uVar4 = *(undefined4 *)&refract_color->field_0x4;
  pTVar1 = refract_color->source;
  (this->refractColor).type = refract_color->type;
  *(undefined4 *)&(this->refractColor).field_0x4 = uVar4;
  (this->refractColor).source = pTVar1;
  Vector3f::Vector3f(&(this->refractColor).color,&refract_color->color);
  std::function<Vector2f_(Vector2f)>::function(&(this->refractColor).scale,&refract_color->scale);
  (this->refractColor).empty = refract_color->empty;
  iVar5 = refract_color->image_h;
  iVar6 = refract_color->image_c;
  uVar4 = *(undefined4 *)&refract_color->field_0x4c;
  puVar2 = refract_color->image_buff_stbi;
  pfVar3 = refract_color->hdr_buff;
  (this->refractColor).image_w = refract_color->image_w;
  (this->refractColor).image_h = iVar5;
  (this->refractColor).image_c = iVar6;
  *(undefined4 *)&(this->refractColor).field_0x4c = uVar4;
  (this->refractColor).image_buff_stbi = puVar2;
  (this->refractColor).hdr_buff = pfVar3;
  this->thickness = thickness;
  fVar7 = 1.0 / coef;
  this->refractCoef = fVar7;
  fVar7 = (1.0 - fVar7) / (fVar7 + 1.0);
  this->r0 = fVar7 * fVar7;
  this_00 = (BRDFMaterial *)operator_new(0x148);
  Vector3f::Vector3f(&local_16c,0.5,0.5,0.5);
  Texture::Texture(&local_90,&local_16c);
  Vector3f::Vector3f(&local_178,0.5,0.5,0.5);
  Texture::Texture(&local_f8,&local_178);
  Vector3f::Vector3f(&local_184,&Vector3f::ZERO);
  Texture::Texture(&local_160,&local_184);
  BRDFMaterial::BRDFMaterial(this_00,&local_90,&local_f8,0.3,&local_160);
  this->m = this_00;
  if (local_160.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_160.scale.super__Function_base._M_manager)
              ((_Any_data *)&local_160.scale,(_Any_data *)&local_160.scale,__destroy_functor);
  }
  if (local_f8.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.scale.super__Function_base._M_manager)
              ((_Any_data *)&local_f8.scale,(_Any_data *)&local_f8.scale,__destroy_functor);
  }
  if (local_90.scale.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.scale.super__Function_base._M_manager)
              ((_Any_data *)&local_90.scale,(_Any_data *)&local_90.scale,__destroy_functor);
  }
  return;
}

Assistant:

GlassMaterial(float coef = 1,
		const Texture & reflect_color = Vector3f::ZERO,
		const Texture & refract_color = Vector3f::ZERO,
		float thickness = 0) :
		refractCoef(coef),
		reflectColor(reflect_color), refractColor(refract_color),
		thickness(thickness) {
		refractCoef = 1 / refractCoef;
		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
		m = new BRDFMaterial(Vector3f(0.5, 0.5, 0.5), Vector3f(0.5, 0.5, 0.5), 0.3);
	}